

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2_agent.c
# Opt level: O3

int main(int argc,char **argv)

{
  in_addr_t iVar1;
  uint uVar2;
  int __fd;
  int iVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  libssh2_agent_publickey *identity;
  sockaddr_in sin;
  
  iVar1 = 0x100007f;
  if ((1 < argc) && (iVar1 = inet_addr(argv[1]), argc != 2)) {
    username = argv[2];
  }
  uVar2 = libssh2_init(0);
  if (uVar2 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar2);
    return 1;
  }
  uVar2 = 1;
  __fd = socket(2,1,0);
  if (__fd == -1) {
    main_cold_11();
    goto LAB_0010185e;
  }
  sin.sin_family = 2;
  sin.sin_port = 0x1600;
  sin.sin_addr.s_addr = iVar1;
  iVar3 = connect(__fd,(sockaddr *)&sin,0x10);
  if (iVar3 == 0) {
    uVar2 = 0;
    lVar4 = libssh2_session_init_ex(0,0,0,0);
    if (lVar4 == 0) {
      main_cold_10();
    }
    else {
      uVar2 = libssh2_session_handshake(lVar4,__fd);
      if (uVar2 == 0) {
        lVar5 = libssh2_hostkey_hash(lVar4,2);
        fwrite("Fingerprint: ",0xd,1,_stderr);
        lVar8 = 0;
        do {
          fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar5 + lVar8));
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x14);
        fputc(10,_stderr);
        pcVar7 = username;
        sVar6 = strlen(username);
        pcVar7 = (char *)libssh2_userauth_list(lVar4,pcVar7,sVar6 & 0xffffffff);
        if (pcVar7 == (char *)0x0) {
          lVar5 = 0;
LAB_001015f5:
          uVar2 = 0;
          lVar8 = libssh2_channel_open_ex(lVar4,"session",7,0x200000,0x8000,0,0);
          if (lVar8 == 0) {
            main_cold_9();
          }
          else {
            libssh2_channel_setenv_ex(lVar8,"FOO",3,"bar",3);
            iVar3 = libssh2_channel_request_pty_ex(lVar8,"vanilla",7,0,0,0x50,0x18,0,0);
            if (iVar3 == 0) {
              uVar2 = 0;
              iVar3 = libssh2_channel_process_startup(lVar8,"shell",5,0,0);
              if (iVar3 != 0) {
                main_cold_8();
                goto LAB_0010173c;
              }
            }
            else {
              main_cold_7();
            }
            libssh2_channel_free(lVar8);
            uVar2 = 0;
          }
LAB_0010173c:
          if (lVar5 != 0) {
LAB_00101818:
            libssh2_agent_disconnect(lVar5);
            libssh2_agent_free(lVar5);
          }
        }
        else {
          uVar2 = 0;
          fprintf(_stderr,"Authentication methods: %s\n",pcVar7);
          pcVar7 = strstr(pcVar7,"publickey");
          if (pcVar7 == (char *)0x0) {
            main_cold_6();
          }
          else {
            lVar5 = libssh2_agent_init(lVar4);
            if (lVar5 != 0) {
              iVar3 = libssh2_agent_connect(lVar5);
              if (iVar3 == 0) {
                iVar3 = libssh2_agent_list_identities(lVar5);
                if (iVar3 == 0) {
                  uVar2 = libssh2_agent_get_identity(lVar5,&identity,0);
                  while (uVar2 != 1) {
                    if ((int)uVar2 < 0) {
                      main_cold_4();
                      uVar2 = 1;
                      goto LAB_0010173c;
                    }
                    iVar3 = libssh2_agent_userauth(lVar5,username,identity);
                    if (iVar3 == 0) {
                      fprintf(_stderr,
                              "Authentication with username %s and public key %s succeeded.\n",
                              username,identity->comment);
                      if (uVar2 != 0) goto LAB_001017e7;
                      goto LAB_001015f5;
                    }
                    fprintf(_stderr,"Authentication with username %s and public key %s failed!\n",
                            username,identity->comment);
                    uVar2 = libssh2_agent_get_identity(lVar5,&identity,identity);
                  }
                  uVar2 = 1;
LAB_001017e7:
                  fwrite("Could not continue authentication\n",0x22,1,_stderr);
                  goto LAB_0010173c;
                }
                main_cold_3();
              }
              else {
                main_cold_2();
              }
              uVar2 = 1;
              goto LAB_00101818;
            }
            main_cold_5();
            uVar2 = 1;
          }
        }
      }
      else {
        fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar2);
      }
      libssh2_session_disconnect_ex(lVar4,0xb,"Normal Shutdown","");
      libssh2_session_free(lVar4);
    }
  }
  else {
    main_cold_1();
    uVar2 = 0;
  }
  shutdown(__fd,2);
  close(__fd);
LAB_0010185e:
  fwrite("all done\n",9,1,_stderr);
  libssh2_exit();
  return uVar2;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i;
    struct sockaddr_in sin;
    const char *fingerprint;
    char *userauthlist;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    LIBSSH2_AGENT *agent = NULL;
    struct libssh2_agent_publickey *identity, *prev_identity = NULL;

#ifdef WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /* Ultra basic "connect to port 22 on localhost".  Your code is
     * responsible for creating the socket establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket!\n");
        rc = 1;
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect!\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session!\n");
        goto shutdown;
    }

    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    /* check what authentication methods are available */
    userauthlist = libssh2_userauth_list(session, username,
                                         (unsigned int)strlen(username));
    if(userauthlist) {
        fprintf(stderr, "Authentication methods: %s\n", userauthlist);
        if(!strstr(userauthlist, "publickey")) {
            fprintf(stderr, "\"publickey\" authentication is not supported\n");
            goto shutdown;
        }

        /* Connect to the ssh-agent */
        agent = libssh2_agent_init(session);
        if(!agent) {
            fprintf(stderr, "Failure initializing ssh-agent support\n");
            rc = 1;
            goto shutdown;
        }
        if(libssh2_agent_connect(agent)) {
            fprintf(stderr, "Failure connecting to ssh-agent\n");
            rc = 1;
            goto shutdown;
        }
        if(libssh2_agent_list_identities(agent)) {
            fprintf(stderr, "Failure requesting identities to ssh-agent\n");
            rc = 1;
            goto shutdown;
        }
        for(;;) {
            rc = libssh2_agent_get_identity(agent, &identity, prev_identity);
            if(rc == 1)
                break;
            if(rc < 0) {
                fprintf(stderr,
                        "Failure obtaining identity from ssh-agent support\n");
                rc = 1;
                goto shutdown;
            }
            if(libssh2_agent_userauth(agent, username, identity)) {
                fprintf(stderr, "Authentication with username %s and "
                        "public key %s failed!\n",
                        username, identity->comment);
            }
            else {
                fprintf(stderr, "Authentication with username %s and "
                        "public key %s succeeded.\n",
                        username, identity->comment);
                break;
            }
            prev_identity = identity;
        }
        if(rc) {
            fprintf(stderr, "Could not continue authentication\n");
            goto shutdown;
        }
    }

    /* We're authenticated now. */

    /* Request a shell */
    channel = libssh2_channel_open_session(session);
    if(!channel) {
        fprintf(stderr, "Unable to open a session\n");
        goto shutdown;
    }

    /* Some environment variables may be set,
     * It's up to the server which ones it'll allow though
     */
    libssh2_channel_setenv(channel, "FOO", "bar");

    /* Request a terminal with 'vanilla' terminal emulation
     * See /etc/termcap for more options. This is useful when opening
     * an interactive shell.
     */
    if(libssh2_channel_request_pty(channel, "vanilla")) {
        fprintf(stderr, "Failed requesting pty\n");
        goto skip_shell;
    }

    /* Open a SHELL on that pty */
    if(libssh2_channel_shell(channel)) {
        fprintf(stderr, "Unable to request shell on allocated pty\n");
        goto shutdown;
    }

    /* At this point the shell can be interacted with using
     * libssh2_channel_read()
     * libssh2_channel_read_stderr()
     * libssh2_channel_write()
     * libssh2_channel_write_stderr()
     *
     * Blocking mode may be (en|dis)abled with: libssh2_channel_set_blocking()
     * If the server send EOF, libssh2_channel_eof() will return non-0
     * To send EOF to the server use: libssh2_channel_send_eof()
     * A channel can be closed with: libssh2_channel_close()
     * A channel can be freed with: libssh2_channel_free()
     */

skip_shell:

    if(channel) {
        libssh2_channel_free(channel);
        channel = NULL;
    }

    /* Other channel types are supported via:
     * libssh2_scp_send()
     * libssh2_scp_recv2()
     * libssh2_channel_direct_tcpip()
     */

shutdown:

    if(agent) {
        libssh2_agent_disconnect(agent);
        libssh2_agent_free(agent);
    }

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
#ifdef WIN32
        closesocket(sock);
#else
        close(sock);
#endif
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

    return rc;
}